

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QModelIndex * __thiscall QAbstractItemView::currentIndex(QAbstractItemView *this)

{
  bool bVar1;
  QModelIndex *in_RDI;
  QAbstractItemViewPrivate *d;
  
  d_func((QAbstractItemView *)0x801911);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x801927);
  if (bVar1) {
    QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x80193e);
    QItemSelectionModel::currentIndex();
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x801957);
  }
  return in_RDI;
}

Assistant:

QModelIndex QAbstractItemView::currentIndex() const
{
    Q_D(const QAbstractItemView);
    return d->selectionModel ? d->selectionModel->currentIndex() : QModelIndex();
}